

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O1

int __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  BufHdr *pBVar1;
  EVP_PKEY_CTX *length;
  C *pCVar2;
  EVP_PKEY_CTX *pEVar3;
  bool bVar4;
  
  if (((EVP_PKEY_CTX *)(this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p !=
       dst) || (length = (EVP_PKEY_CTX *)
                         (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).
                         m_length, length != src && src != (EVP_PKEY_CTX *)0xffffffffffffffff)) {
    length = src;
    if (src == (EVP_PKEY_CTX *)0xffffffffffffffff) {
      if (dst == (EVP_PKEY_CTX *)0x0) {
        length = (EVP_PKEY_CTX *)0x0;
      }
      else {
        length = (EVP_PKEY_CTX *)strlen((char *)dst);
      }
    }
    pBVar1 = (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr;
    if (length == (EVP_PKEY_CTX *)0x0) {
      if (pBVar1 != (BufHdr *)0x0) {
        if ((pBVar1->super_RefCount).m_refCount == 1) {
          (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p =
               (C *)(pBVar1 + 1);
          *(undefined1 *)&pBVar1[1].super_RefCount._vptr_RefCount = 0;
          (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length = 0;
        }
        else {
          StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
                    (&this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
        }
      }
      length = (EVP_PKEY_CTX *)0x0;
    }
    else if ((pBVar1 == (BufHdr *)0x0) ||
            (pEVar3 = (EVP_PKEY_CTX *)
                      ((long)&pBVar1[1].super_RefCount._vptr_RefCount + pBVar1->m_bufferSize),
            pEVar3 <= dst || dst < pBVar1 + 1)) {
      pCVar2 = createBuffer(this,(size_t)length,false);
      if (pCVar2 == (C *)0x0) {
        length = (EVP_PKEY_CTX *)0xffffffffffffffff;
      }
      else {
        __wrap_memcpy((this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p,dst,
                      (size_t)length);
      }
    }
    else {
      (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p = (C *)dst;
      (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length = (size_t)length
      ;
      if (dst + (long)length < pEVar3) {
        bVar4 = dst[(long)length] == (EVP_PKEY_CTX)0x0;
      }
      else {
        bVar4 = false;
      }
      (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_isNullTerminated =
           bVar4;
    }
  }
  return (int)length;
}

Assistant:

size_t
	copy(
		const C* p,
		size_t length = -1
	) {
		if (p == this->m_p && (length == -1 || length == this->m_length))
			return this->m_length;

		if (length == -1)
			length = Details::calcLength(p);

		if (!length) {
			clear();
			return 0;
		}

		if (this->m_hdr && this->m_hdr->isInsideBuffer(p)) {
			C* end = (C*)this->m_hdr->getEnd();
			ASSERT(p + length <= end);

			this->m_p = (C*)p;
			this->m_length = length;
			this->m_isNullTerminated = p + length < end && !p[length];
			return length;
		}

		if (!createBuffer(length, false))
			return -1;

		Details::copy(this->m_p, p, length);
		return length;
	}